

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deDynamicLibrary.cpp
# Opt level: O3

void __thiscall de::DynamicLibrary::DynamicLibrary(DynamicLibrary *this,char *fileName)

{
  deDynamicLibrary *pdVar1;
  runtime_error *this_00;
  long *plVar2;
  long *plVar3;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  this->m_library = (deDynamicLibrary *)0x0;
  pdVar1 = deDynamicLibrary_open(fileName);
  this->m_library = pdVar1;
  if (pdVar1 != (deDynamicLibrary *)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,"Failed to open dynamic library: \'","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_90);
  local_70 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_70 == plVar3) {
    local_60 = *plVar3;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar3;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_50 == plVar3) {
    local_40 = *plVar3;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar3;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

DynamicLibrary::DynamicLibrary (const char* fileName)
	: m_library(DE_NULL)
{
	m_library = deDynamicLibrary_open(fileName);
	if (!m_library)
		throw std::runtime_error(std::string("Failed to open dynamic library: '") + fileName + "'");
}